

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_resize(mp_int *mp,size_t newmaxbits)

{
  mp_int *pmVar1;
  ulong uVar2;
  
  pmVar1 = mp_make_sized(newmaxbits + 0x3f >> 6);
  uVar2 = mp->nw;
  if (pmVar1->nw < mp->nw) {
    uVar2 = pmVar1->nw;
  }
  memmove(pmVar1->w,mp->w,uVar2 * 8);
  smemclr(pmVar1->w + uVar2,(pmVar1->nw - uVar2) * 8);
  mp_free(mp);
  return pmVar1;
}

Assistant:

mp_int *mp_resize(mp_int *mp, size_t newmaxbits)
{
    mp_int *copy = mp_new(newmaxbits);
    mp_copy_into(copy, mp);
    mp_free(mp);
    return copy;
}